

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall cmCursesLongMessageForm::~cmCursesLongMessageForm(cmCursesLongMessageForm *this)

{
  cmCursesLongMessageForm *this_local;
  
  (this->super_cmCursesForm)._vptr_cmCursesForm =
       (_func_int **)&PTR__cmCursesLongMessageForm_00a77928;
  if (this->Fields[0] != (FIELD *)0x0) {
    free_field(this->Fields[0]);
  }
  std::__cxx11::string::~string((string *)&this->Title);
  std::__cxx11::string::~string((string *)&this->Messages);
  cmCursesForm::~cmCursesForm(&this->super_cmCursesForm);
  return;
}

Assistant:

cmCursesLongMessageForm::~cmCursesLongMessageForm()
{
  if (this->Fields[0])
    {
    free_field(this->Fields[0]);
    }
}